

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSimpleUnaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Type type;
  Newline local_51;
  Type local_50;
  StackVar local_48;
  Type local_3c;
  StackVar local_34;
  Type local_28;
  Type result_type;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  result_type = (Type)op;
  this_local._4_4_ = opcode.enum_;
  local_3c = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_28 = local_3c;
  StackVar::StackVar(&local_34,0,local_3c);
  Type::Type(&local_50,Any);
  StackVar::StackVar(&local_48,0,local_50);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_34,(char (*) [4])0x361f7f,(char **)&result_type,
             (char (*) [2])0x36256a,&local_48,(char (*) [3])0x36445f,&local_51);
  DropTypes(this,1);
  type = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WriteSimpleUnaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", op, "(", StackVar(0), ");", Newline());
  DropTypes(1);
  PushType(opcode.GetResultType());
}